

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_scan.cpp
# Opt level: O3

void __thiscall duckdb::DuckTableScanState::~DuckTableScanState(DuckTableScanState *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer puVar1;
  
  (this->super_TableScanGlobalState).super_GlobalTableFunctionState._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__DuckTableScanState_02445d40;
  this_00 = (this->state).checkpoint_lock.internal.
            super___shared_ptr<duckdb::CheckpointLock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_TableScanGlobalState).super_GlobalTableFunctionState._vptr_GlobalTableFunctionState =
       (_func_int **)&PTR__TableScanGlobalState_02445db8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &(this->super_TableScanGlobalState).scanned_types);
  puVar1 = (this->super_TableScanGlobalState).projection_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  GlobalTableFunctionState::~GlobalTableFunctionState((GlobalTableFunctionState *)this);
  operator_delete(this);
  return;
}

Assistant:

DuckTableScanState(ClientContext &context, const FunctionData *bind_data_p)
	    : TableScanGlobalState(context, bind_data_p) {
	}